

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RandJoinClauseSyntax *pRVar1;
  DeepCloneVisitor visitor;
  ParenthesizedExpressionSyntax *local_38;
  Token local_30;
  Token local_20;
  
  local_20 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_38 = (ParenthesizedExpressionSyntax *)0x0;
  }
  else {
    local_38 = (ParenthesizedExpressionSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RandJoinClauseSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax*>
                     ((BumpAllocator *)__child_stack,&local_20,&local_30,&local_38);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RandJoinClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RandJoinClauseSyntax>(
        node.rand.deepClone(alloc),
        node.join.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr
    );
}